

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::Lex(SQLexer *this)

{
  int iVar1;
  SQLexer *pSVar2;
  ulong uVar3;
  ulong *in_RDI;
  bool in_stack_0000001f;
  SQInteger in_stack_00000020;
  SQInteger c;
  SQInteger t;
  SQInteger ret_1;
  SQInteger ret;
  SQInteger stype_1;
  SQInteger stype;
  SQChar *in_stack_ffffffffffffff98;
  SQLexer *in_stack_ffffffffffffffa0;
  SQLexer *in_stack_ffffffffffffffc0;
  SQLexer *in_stack_ffffffffffffffc8;
  
  in_RDI[5] = in_RDI[4];
  do {
    if ((char)in_RDI[0xc] == '\0') {
      return 0;
    }
    pSVar2 = (SQLexer *)(ulong)(byte)in_RDI[0xc];
    switch(pSVar2) {
    default:
      iVar1 = isdigit((uint)(byte)in_RDI[0xc]);
      if (iVar1 != 0) {
        uVar3 = ReadNumber(in_stack_ffffffffffffffc8);
        in_RDI[3] = *in_RDI;
        *in_RDI = uVar3;
        return uVar3;
      }
      iVar1 = isalpha((uint)(byte)in_RDI[0xc]);
      if ((iVar1 == 0) && ((char)in_RDI[0xc] != '_')) {
        uVar3 = (ulong)(byte)in_RDI[0xc];
        iVar1 = iscntrl((uint)(byte)in_RDI[0xc]);
        if (iVar1 != 0) {
          Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = uVar3;
        return uVar3;
      }
      uVar3 = ReadID(in_stack_ffffffffffffffc0);
      in_RDI[3] = *in_RDI;
      *in_RDI = uVar3;
      return uVar3;
    case (SQLexer *)0x9:
    case (SQLexer *)0xd:
    case (SQLexer *)0x20:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      break;
    case (SQLexer *)0xa:
      in_RDI[4] = in_RDI[4] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 10;
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[6] = 1;
      break;
    case (SQLexer *)0x21:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '=') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x21;
        return 0x21;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x109;
      return 0x109;
    case (SQLexer *)0x23:
      LexLineComment(in_stack_ffffffffffffffa0);
      break;
    case (SQLexer *)0x25:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] == '=') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x13f;
        return 0x13f;
      }
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x25;
      return 0x25;
    case (SQLexer *)0x26:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '&') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x26;
        return 0x26;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x10e;
      return 0x10e;
    case (SQLexer *)0x2a:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] == '=') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x13d;
        return 0x13d;
      }
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x2a;
      return 0x2a;
    case (SQLexer *)0x2b:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] == '=') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x121;
        return 0x121;
      }
      if ((char)in_RDI[0xc] == '+') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x12f;
        return 0x12f;
      }
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x2b;
      return 0x2b;
    case (SQLexer *)0x2d:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] == '=') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x122;
        return 0x122;
      }
      if ((char)in_RDI[0xc] == '-') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x130;
        return 0x130;
      }
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x2d;
      return 0x2d;
    case (SQLexer *)0x2e:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '.') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x2e;
        return 0x2e;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '.') {
        Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x138;
      return 0x138;
    case (SQLexer *)0x2f:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      switch((char)in_RDI[0xc]) {
      case '*':
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        LexBlockComment(pSVar2);
        break;
      default:
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x2f;
        return 0x2f;
      case '/':
        LexLineComment(in_stack_ffffffffffffffa0);
        break;
      case '=':
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x13e;
        return 0x13e;
      case '>':
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x141;
        return 0x141;
      }
      break;
    case (SQLexer *)0x3a:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != ':') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x3a;
        return 0x3a;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 299;
      return 299;
    case (SQLexer *)0x3c:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      pSVar2 = (SQLexer *)(ulong)((byte)in_RDI[0xc] - 0x2d);
      switch(pSVar2) {
      case (SQLexer *)0x0:
        Next(pSVar2);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x119;
        return 0x119;
      default:
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x3c;
        return 0x3c;
      case (SQLexer *)0x2:
        Next(pSVar2);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x140;
        return 0x140;
      case (SQLexer *)0xf:
        Next(pSVar2);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x128;
        return 0x128;
      case (SQLexer *)0x10:
        goto switchD_001346f1_caseD_10;
      }
    case (SQLexer *)0x3d:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '=') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x3d;
        return 0x3d;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x108;
      return 0x108;
    case (SQLexer *)0x3e:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] == '=') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x10b;
        return 0x10b;
      }
      if ((char)in_RDI[0xc] == '>') {
        Next(in_stack_ffffffffffffffa0);
        in_RDI[6] = in_RDI[6] + 1;
        if ((char)in_RDI[0xc] == '>') {
          Next(in_stack_ffffffffffffffa0);
          in_RDI[6] = in_RDI[6] + 1;
          in_RDI[3] = *in_RDI;
          *in_RDI = 0x132;
          return 0x132;
        }
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x129;
        return 0x129;
      }
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x3e;
      return 0x3e;
    case (SQLexer *)0x40:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '\"') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x40;
        return 0x40;
      }
      uVar3 = ReadString((SQLexer *)c,in_stack_00000020,in_stack_0000001f);
      if (uVar3 != 0xffffffffffffffff) {
        in_RDI[3] = *in_RDI;
        *in_RDI = uVar3;
        return uVar3;
      }
      Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    case (SQLexer *)0x22:
    case (SQLexer *)0x27:
      uVar3 = ReadString((SQLexer *)c,in_stack_00000020,in_stack_0000001f);
      if (uVar3 != 0xffffffffffffffff) {
        in_RDI[3] = *in_RDI;
        *in_RDI = uVar3;
        return uVar3;
      }
      Error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    case (SQLexer *)0x28:
    case (SQLexer *)0x29:
    case (SQLexer *)0x2c:
    case (SQLexer *)0x3b:
    case (SQLexer *)0x3f:
    case (SQLexer *)0x5b:
    case (SQLexer *)0x5d:
    case (SQLexer *)0x5e:
    case (SQLexer *)0x7b:
    case (SQLexer *)0x7d:
    case (SQLexer *)0x7e:
      uVar3 = in_RDI[0xc];
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = (ulong)(byte)uVar3;
      return (ulong)(byte)uVar3;
    case (SQLexer *)0x7c:
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      if ((char)in_RDI[0xc] != '|') {
        in_RDI[3] = *in_RDI;
        *in_RDI = 0x7c;
        return 0x7c;
      }
      Next(in_stack_ffffffffffffffa0);
      in_RDI[6] = in_RDI[6] + 1;
      in_RDI[3] = *in_RDI;
      *in_RDI = 0x10f;
      return 0x10f;
    }
  } while( true );
switchD_001346f1_caseD_10:
  Next(pSVar2);
  in_RDI[6] = in_RDI[6] + 1;
  if ((char)in_RDI[0xc] == '>') {
    Next(pSVar2);
    in_RDI[6] = in_RDI[6] + 1;
    in_RDI[3] = *in_RDI;
    *in_RDI = 0x131;
    return 0x131;
  }
  in_RDI[3] = *in_RDI;
  *in_RDI = 0x10a;
  return 0x10a;
}

Assistant:

SQInteger SQLexer::Lex()
{
    _lasttokenline = _currentline;
    while(CUR_CHAR != SQUIRREL_EOB) {
        switch(CUR_CHAR){
        case _SC('\t'): case _SC('\r'): case _SC(' '): NEXT(); continue;
        case _SC('\n'):
            _currentline++;
            _prevtoken=_curtoken;
            _curtoken=_SC('\n');
            NEXT();
            _currentcolumn=1;
            continue;
        case _SC('#'): LexLineComment(); continue;
        case _SC('/'):
            NEXT();
            switch(CUR_CHAR){
            case _SC('*'):
                NEXT();
                LexBlockComment();
                continue;
            case _SC('/'):
                LexLineComment();
                continue;
            case _SC('='):
                NEXT();
                RETURN_TOKEN(TK_DIVEQ);
                continue;
            case _SC('>'):
                NEXT();
                RETURN_TOKEN(TK_ATTR_CLOSE);
                continue;
            default:
                RETURN_TOKEN('/');
            }
        case _SC('='):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('=') }
            else { NEXT(); RETURN_TOKEN(TK_EQ); }
        case _SC('<'):
            NEXT();
            switch(CUR_CHAR) {
            case _SC('='):
                NEXT();
                if(CUR_CHAR == _SC('>')) {
                    NEXT();
                    RETURN_TOKEN(TK_3WAYSCMP);
                }
                RETURN_TOKEN(TK_LE)
                break;
            case _SC('-'): NEXT(); RETURN_TOKEN(TK_NEWSLOT); break;
            case _SC('<'): NEXT(); RETURN_TOKEN(TK_SHIFTL); break;
            case _SC('/'): NEXT(); RETURN_TOKEN(TK_ATTR_OPEN); break;
            }
            RETURN_TOKEN('<');
        case _SC('>'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_GE);}
            else if(CUR_CHAR == _SC('>')){
                NEXT();
                if(CUR_CHAR == _SC('>')){
                    NEXT();
                    RETURN_TOKEN(TK_USHIFTR);
                }
                RETURN_TOKEN(TK_SHIFTR);
            }
            else { RETURN_TOKEN('>') }
        case _SC('!'):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('!')}
            else { NEXT(); RETURN_TOKEN(TK_NE); }
        case _SC('@'): {
            SQInteger stype;
            NEXT();
            if(CUR_CHAR != _SC('"')) {
                RETURN_TOKEN('@');
            }
            if((stype=ReadString('"',true))!=-1) {
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
                       }
        case _SC('"'):
        case _SC('\''): {
            SQInteger stype;
            if((stype=ReadString(CUR_CHAR,false))!=-1){
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
            }
        case _SC('{'): case _SC('}'): case _SC('('): case _SC(')'): case _SC('['): case _SC(']'):
        case _SC(';'): case _SC(','): case _SC('?'): case _SC('^'): case _SC('~'):
            {SQInteger ret = CUR_CHAR;
            NEXT(); RETURN_TOKEN(ret); }
        case _SC('.'):
            NEXT();
            if (CUR_CHAR != _SC('.')){ RETURN_TOKEN('.') }
            NEXT();
            if (CUR_CHAR != _SC('.')){ Error(_SC("invalid token '..'")); }
            NEXT();
            RETURN_TOKEN(TK_VARPARAMS);
        case _SC('&'):
            NEXT();
            if (CUR_CHAR != _SC('&')){ RETURN_TOKEN('&') }
            else { NEXT(); RETURN_TOKEN(TK_AND); }
        case _SC('|'):
            NEXT();
            if (CUR_CHAR != _SC('|')){ RETURN_TOKEN('|') }
            else { NEXT(); RETURN_TOKEN(TK_OR); }
        case _SC(':'):
            NEXT();
            if (CUR_CHAR != _SC(':')){ RETURN_TOKEN(':') }
            else { NEXT(); RETURN_TOKEN(TK_DOUBLE_COLON); }
        case _SC('*'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MULEQ);}
            else RETURN_TOKEN('*');
        case _SC('%'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MODEQ);}
            else RETURN_TOKEN('%');
        case _SC('-'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MINUSEQ);}
            else if  (CUR_CHAR == _SC('-')){ NEXT(); RETURN_TOKEN(TK_MINUSMINUS);}
            else RETURN_TOKEN('-');
        case _SC('+'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_PLUSEQ);}
            else if (CUR_CHAR == _SC('+')){ NEXT(); RETURN_TOKEN(TK_PLUSPLUS);}
            else RETURN_TOKEN('+');
        case SQUIRREL_EOB:
            return 0;
        default:{
                if (scisdigit(CUR_CHAR)) {
                    SQInteger ret = ReadNumber();
                    RETURN_TOKEN(ret);
                }
                else if (scisalpha(CUR_CHAR) || CUR_CHAR == _SC('_')) {
                    SQInteger t = ReadID();
                    RETURN_TOKEN(t);
                }
                else {
                    SQInteger c = CUR_CHAR;
                    if (sciscntrl((int)c)) Error(_SC("unexpected character(control)"));
                    NEXT();
                    RETURN_TOKEN(c);
                }
                RETURN_TOKEN(0);
            }
        }
    }
    return 0;
}